

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O2

Am_Object create_script_execute_command
                    (Am_Object *script_window,Am_Value_List *commands_to_execute,Am_Object *window,
                    Am_Object *sel_widget,Am_String *name)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Object *pAVar2;
  Am_String *in_R9;
  Am_Input_Char noop;
  Am_Input_Char local_44;
  Am_Value_List local_40;
  
  Am_Input_Char::Am_Input_Char(&local_44,0,false,false,false,Am_NEITHER,Am_NOT_MOUSE,false);
  in_value = Am_Object::Get((Am_Object *)commands_to_execute,Am_SCRIPT_EXECUTE_COMMAND,0);
  Am_Object::Am_Object(script_window,in_value);
  bVar1 = Am_Object::Valid(script_window);
  if (bVar1) {
    pAVar2 = Am_Object::Set(script_window,0x150,in_R9,0);
    Am_Input_Char::operator_cast_to_Am_Value(&local_44);
    pAVar2 = Am_Object::Set(pAVar2,0x152,(Am_Value *)&local_40,0);
    Am_Object::Set(pAVar2,Am_EXECUTE_SCRIPT_ON_NEW,false,0);
    Am_Value::~Am_Value((Am_Value *)&local_40);
  }
  else {
    create_script_for(&local_40,SUB84(window,0),(Am_String *)(ulong)(uint)local_44,SUB81(in_R9,0),
                      (Am_Object *)0x0,sel_widget);
    Am_Object::operator=(script_window,(Am_Object *)&local_40);
    Am_Object::~Am_Object((Am_Object *)&local_40);
  }
  return (Am_Object)(Am_Object_Data *)script_window;
}

Assistant:

Am_Object
create_script_execute_command(Am_Object &script_window,
                              Am_Value_List &commands_to_execute,
                              Am_Object &window, Am_Object &sel_widget,
                              Am_String name)
{
  // Am_Object on_new_buttons = script_window.Get_Object(Am_UNDO_OPTIONS);
  // bool on_new = (int)on_new_buttons.Get(Am_VALUE) == Am_ID_ON_SELECTION;
  bool on_new = false;
  Am_Input_Char noop; //Am_No_Input_Char not defined

  Am_Object script_execute_command =
      script_window.Get(Am_SCRIPT_EXECUTE_COMMAND);
  if (script_execute_command.Valid()) { //then edit it
    script_execute_command.Set(Am_LABEL, name)
        .Set(Am_ACCELERATOR, noop)
        .Set(Am_EXECUTE_SCRIPT_ON_NEW, on_new);
  } else
    script_execute_command = create_script_for(commands_to_execute, noop, name,
                                               on_new, window, sel_widget);
  return script_execute_command;
}